

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# monster.c
# Opt level: O2

int create_monster_bottom_up(flatcc_builder_t *B,int flexible)

{
  flatcc_builder_ref_t fVar1;
  flatcc_builder_ref_t fVar2;
  MyGame_Sample_Weapon_ref_t ref;
  uint ref_00;
  flatbuffers_uint8_vec_ref_t ref_01;
  int iVar3;
  flatcc_builder_ref_t root;
  MyGame_Sample_Vec3_t *pMVar4;
  uint *puVar5;
  undefined1 *puVar6;
  size_t len;
  flatcc_builder_ref_t fVar7;
  MyGame_Sample_Color_enum_t v;
  int16_t v_00;
  char *fid;
  undefined8 uVar8;
  float v0;
  float in_XMM1_Da;
  float in_XMM2_Da;
  uint8_t treasure [10];
  
  fVar1 = flatcc_builder_create_string_str(B,"Sword");
  fVar2 = flatcc_builder_create_string_str(B,"Axe");
  ref = MyGame_Sample_Weapon_create(B,fVar1,3);
  ref_00 = MyGame_Sample_Weapon_create(B,fVar2,5);
  fVar1 = flatcc_builder_create_string_str(B,"Orc");
  treasure[0] = '\0';
  treasure[1] = '\x01';
  treasure[2] = '\x02';
  treasure[3] = '\x03';
  treasure[4] = '\x04';
  treasure[5] = '\x05';
  treasure[6] = '\x06';
  treasure[7] = '\a';
  treasure[8] = '\b';
  treasure[9] = '\t';
  ref_01 = flatbuffers_uint8_vec_create(B,treasure,len);
  flatcc_builder_start_offset_vector(B);
  MyGame_Sample_Weapon_vec_push(B,ref);
  fid = (char *)(ulong)ref_00;
  MyGame_Sample_Weapon_vec_push(B,ref_00);
  fVar2 = flatcc_builder_end_offset_vector(B);
  if (flexible == 0) {
    iVar3 = flatbuffers_buffer_start(B,fid);
    if (iVar3 == 0) {
      iVar3 = MyGame_Sample_Monster_start(B);
      fVar7 = 0;
      root = 0;
      if (iVar3 == 0) {
        pMVar4 = MyGame_Sample_Monster_pos_start(B);
        root = 0;
        if (pMVar4 != (MyGame_Sample_Vec3_t *)0x0) {
          pMVar4->x = 1.0;
          pMVar4->y = 2.0;
          pMVar4->z = 3.0;
          iVar3 = MyGame_Sample_Monster_name_add(B,fVar1);
          root = fVar7;
          if (iVar3 == 0) {
            iVar3 = MyGame_Sample_Monster_inventory_add(B,ref_01);
            if (iVar3 == 0) {
              iVar3 = MyGame_Sample_Monster_weapons_add(B,fVar2);
              if (iVar3 == 0) {
                uVar8 = 9;
                puVar5 = (uint *)flatcc_builder_table_add_offset(B,9);
                if (puVar5 != (uint *)0x0) {
                  *puVar5 = ref_00;
                  iVar3 = MyGame_Sample_Monster_hp_add(B,(int16_t)uVar8);
                  if (iVar3 == 0) {
                    iVar3 = MyGame_Sample_Monster_color_add(B,(MyGame_Sample_Color_enum_t)uVar8);
                    if (iVar3 == 0) {
                      puVar6 = (undefined1 *)flatcc_builder_table_add(B,8,1,1);
                      if (puVar6 != (undefined1 *)0x0) {
                        *puVar6 = 1;
                        root = MyGame_Sample_Monster_end(B);
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
      flatcc_builder_end_buffer(B,root);
    }
  }
  else {
    MyGame_Sample_Monster_start_as_root(B);
    v_00 = (int16_t)fid;
    MyGame_Sample_Monster_pos_create(B,v0,in_XMM1_Da,in_XMM2_Da);
    MyGame_Sample_Monster_hp_add(B,v_00);
    MyGame_Sample_Monster_name_add(B,fVar1);
    v = (MyGame_Sample_Color_enum_t)ref_01;
    MyGame_Sample_Monster_inventory_add(B,ref_01);
    MyGame_Sample_Monster_color_add(B,v);
    MyGame_Sample_Monster_weapons_add(B,fVar2);
    MyGame_Sample_Monster_equipped_add
              (B,(MyGame_Sample_Equipment_union_ref_t)(((long)(ulong)ref_00 << 0x20) + 1));
    MyGame_Sample_Monster_end_as_root(B);
  }
  return 0;
}

Assistant:

int create_monster_bottom_up(flatcc_builder_t *B, int flexible)
{
    flatbuffers_string_ref_t weapon_one_name = flatbuffers_string_create_str(B, "Sword");
    int16_t weapon_one_damage = 3;

    flatbuffers_string_ref_t weapon_two_name = flatbuffers_string_create_str(B, "Axe");
    int16_t weapon_two_damage = 5;

    // Use the `MyGame_Sample_Weapon_create` shortcut to create Weapons
    // with all the fields set.
    //
    // In the C-API, verbs (here create) always follow the type name
    // (here Weapon), prefixed by the namespace (here MyGame_Sample_):
    // MyGame_Sample_Weapon_create(...), or ns(Weapone_create(...)).
    ns(Weapon_ref_t) sword = ns(Weapon_create(B, weapon_one_name, weapon_one_damage));
    ns(Weapon_ref_t) axe = ns(Weapon_create(B, weapon_two_name, weapon_two_damage));

    // Serialize a name for our monster, called "Orc".
    // The _str suffix indicates the source is an ascii-z string.
    flatbuffers_string_ref_t name = flatbuffers_string_create_str(B, "Orc");

    // Create a `vector` representing the inventory of the Orc. Each number
    // could correspond to an item that can be claimed after he is slain.
    uint8_t treasure[] = {0, 1, 2, 3, 4, 5, 6, 7, 8, 9};
    flatbuffers_uint8_vec_ref_t inventory;
    // `c_vec_len` is the convenience macro we defined earlier.
    inventory = flatbuffers_uint8_vec_create(B, treasure, c_vec_len(treasure));

    // Here we use a top-down approach locally to build a Weapons vector
    // in-place instead of creating a temporary external vector to use
    // as argument like we did with the `inventory` earlier on, but the
    // overall approach is still bottom-up.
    ns(Weapon_vec_start(B));
    ns(Weapon_vec_push(B, sword));
    ns(Weapon_vec_push(B, axe));
    ns(Weapon_vec_ref_t) weapons = ns(Weapon_vec_end(B));


    // Create a `Vec3`, representing the Orc's position in 3-D space.
    ns(Vec3_t) pos = { 1.0f, 2.0f, 3.0f };


    // Set his hit points to 300 and his mana to 150.
    int16_t hp = 300;
    // The default value is 150, so we will never store this field.
    int16_t mana = 150;

    // Create the equipment union. In the C++ language API this is given
    // as two arguments to the create call, or as two separate add
    // operations for the type and the table reference. Here we create
    // a single union value that carries both the type and reference.
    ns(Equipment_union_ref_t) equipped = ns(Equipment_as_Weapon(axe));

    if (!flexible) {
        // Finally, create the monster using the `Monster_create` helper function
        // to set all fields.
        //
        // Note that the Equipment union only take up one argument in C, where
        // C++ takes a type and an object argument.
        ns(Monster_create_as_root(B, &pos, mana, hp, name, inventory, ns(Color_Red),
                             weapons, equipped));

        // Unlike C++ we do not use a Finish call. Instead we use the
        // `create_as_root` action which has better type safety and
        // simplicity.
        //
        // However, we can also express this as:
        //
        // ns(Monster_ref_t) orc = ns(Monster_create(B, ...));
        // flatcc_builder_buffer_create(orc);
        //
        // In this approach the function should return the orc and
        // let a calling function handle the flatcc_buffer_create call
        // for a more composable setup that is also able to create child
        // monsters. In general, `flatcc_builder` calls are best isolated
        // in a containing driver function.

    } else {

        // A more flexible approach where we mix bottom-up and top-down
        // style. We still create child objects first, but then create
        // a top-down style monster object that we can manipulate in more
        // detail.

        // It is important to pair `start_as_root` with `end_as_root`.
        ns(Monster_start_as_root(B));
        ns(Monster_pos_create(B, 1.0f, 2.0f, 3.0f));
        // or alternatively
        //ns(Monster_pos_add(&pos);

        ns(Monster_hp_add(B, hp));
        // Notice that `Monser_name_add` adds a string reference unlike the
        // add_str and add_strn variants.
        ns(Monster_name_add(B, name));
        ns(Monster_inventory_add(B, inventory));
        ns(Monster_color_add(B, ns(Color_Red)));
        ns(Monster_weapons_add(B, weapons));
        ns(Monster_equipped_add(B, equipped));
        // Complete the monster object and make it the buffer root object.
        ns(Monster_end_as_root(B));

        // We could also drop the `as_root` suffix from Monster_start/end(B)
        // and add the table as buffer root later:
        //
        // ns(Monster_ref_t) orc = ns(Monster_start(B));
        // ...
        // ns(Monster_ref_t) orc = ns(Monster_end(B));
        // flatcc_builder_buffer_create(orc);
        //
        // It is best to keep the `flatcc_builder` calls in a containing
        // driver function for modularity.
    }
    return 0;
}